

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiColumns *pIVar1;
  int iVar2;
  float fVar3;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (column_index < 0) {
    column_index = pIVar1->Current;
    iVar2 = column_index;
    if (column_index < 0) {
      iVar2 = pIVar1->Current;
    }
  }
  else {
    iVar2 = column_index;
    if (pIVar1 == (ImGuiColumns *)0x0) {
      fVar3 = 0.0;
      goto LAB_00195664;
    }
  }
  fVar3 = (pIVar1->OffMaxX - pIVar1->OffMinX) * (pIVar1->Columns).Data[iVar2].OffsetNorm +
          pIVar1->OffMinX;
LAB_00195664:
  SetColumnOffset(column_index + 1,fVar3 + width);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }